

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqfuncstate.cpp
# Opt level: O0

void __thiscall SQFuncState::DiscardTarget(SQFuncState *this)

{
  size_type sVar1;
  ulong uVar2;
  SQInstruction *pSVar3;
  long in_RDI;
  SQInstruction *pi;
  SQInteger size;
  SQInteger discardedtarget;
  SQFuncState *in_stack_ffffffffffffffe0;
  
  uVar2 = PopTarget(in_stack_ffffffffffffffe0);
  sVar1 = sqvector<SQInstruction,_unsigned_int>::size
                    ((sqvector<SQInstruction,_unsigned_int> *)(in_RDI + 200));
  if ((sVar1 != 0) && ((*(byte *)(in_RDI + 0x1e0) & 1) != 0)) {
    pSVar3 = sqvector<SQInstruction,_unsigned_int>::operator[]
                       ((sqvector<SQInstruction,_unsigned_int> *)(in_RDI + 200),sVar1 - 1);
    switch(pSVar3->op) {
    case '\x06':
    case '\v':
    case '\f':
    case '\x0e':
    case '\x0f':
    case '\x10':
    case '(':
    case 'I':
      if (pSVar3->_arg0 == uVar2) {
        pSVar3->_arg0 = 0xff;
      }
    }
  }
  return;
}

Assistant:

void SQFuncState::DiscardTarget()
{
    SQInteger discardedtarget = PopTarget();
    SQInteger size = _instructions.size();
    if(size > 0 && _optimization){
        SQInstruction &pi = _instructions[size-1];//previous instruction
        switch(pi.op) {
        case _OP_SETI:case _OP_SETK:case _OP_SET:case _OP_NEWSLOTK:case _OP_NEWSLOT:case _OP_SETOUTER:case _OP_CALL:case _OP_NULLCALL:
            if(pi._arg0 == discardedtarget) {
                pi._arg0 = 0xFF;
            }
        }
    }
}